

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pt_packet_decoder.c
# Opt level: O2

int pt_pkt_sync_forward(pt_packet_decoder *decoder)

{
  uint8_t *puVar1;
  int iVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *sync;
  
  if (decoder != (pt_packet_decoder *)0x0) {
    puVar1 = (decoder->config).begin;
    sync = decoder->sync;
    puVar4 = decoder->pos;
    if (decoder->pos == (uint8_t *)0x0) {
      puVar4 = puVar1;
    }
    puVar4 = puVar4 + (ulong)(puVar4 == sync) * 0x10;
    if (puVar4 < puVar1) {
      iVar2 = -1;
    }
    else {
      lVar3 = 0xf;
      if ((long)puVar4 - (long)puVar1 < 0xf) {
        lVar3 = (long)puVar4 - (long)puVar1;
      }
      iVar2 = pt_sync_forward(&sync,puVar4 + -lVar3,&decoder->config);
      if (-1 < iVar2) {
        decoder->sync = sync;
        decoder->pos = sync;
        iVar2 = 0;
      }
    }
    return iVar2;
  }
  return -2;
}

Assistant:

int pt_pkt_sync_forward(struct pt_packet_decoder *decoder)
{
	const uint8_t *pos, *sync, *begin;
	ptrdiff_t space;
	int errcode;

	if (!decoder)
		return -pte_invalid;

	begin = decoder->config.begin;
	sync = decoder->sync;
	pos = decoder->pos;
	if (!pos)
		pos = begin;

	if (pos == sync)
		pos += ptps_psb;

	if (pos < begin)
		return -pte_internal;

	/* Start a bit earlier so we find PSB that have been partially consumed
	 * by a preceding packet.
	 */
	space = pos - begin;
	if (ptps_psb <= space)
		space = ptps_psb - 1;

	pos -= space;

	errcode = pt_sync_forward(&sync, pos, &decoder->config);
	if (errcode < 0)
		return errcode;

	decoder->sync = sync;
	decoder->pos = sync;

	return 0;
}